

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O2

int __thiscall MPEG2StreamReader::intDecodeNAL(MPEG2StreamReader *this,uint8_t *buff)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *puVar3;
  
  uVar1 = *buff;
  if (uVar1 == '\0') {
    iVar2 = decodePicture(this,buff);
    return iVar2;
  }
  if (uVar1 == 0xb8) {
    *(undefined8 *)&(this->super_MPEGStreamReader).field_0xdc = 0xffffffffffffffff;
  }
  else {
    if (uVar1 == 0xb5) {
      iVar2 = processExtStartCode(this,buff);
      return iVar2;
    }
    if (uVar1 == 0xb3) {
      iVar2 = processSeqStartCode(this,buff);
      do {
        if (iVar2 != 0) {
          return iVar2;
        }
        puVar3 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
        while( true ) {
          puVar3 = MPEGHeader::findNextMarker(buff,puVar3);
          buff = puVar3 + 3;
          puVar3 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
          if (puVar3 <= buff) {
            return -10;
          }
          uVar1 = *buff;
          if (uVar1 == 0xb5) break;
          if (uVar1 == 0xb8) {
            *(undefined8 *)&(this->super_MPEGStreamReader).field_0xdc = 0xffffffffffffffff;
          }
          else if (uVar1 == '\0') {
            iVar2 = decodePicture(this,buff);
            if (iVar2 == 0) {
              (this->super_MPEGStreamReader).m_lastDecodedPos = buff;
              return 0;
            }
            return iVar2;
          }
        }
        iVar2 = processExtStartCode(this,buff);
      } while( true );
    }
  }
  return 0;
}

Assistant:

int MPEG2StreamReader::intDecodeNAL(uint8_t* buff)
{
    try
    {
        int rez;
        uint8_t* nextNal;
        switch (*buff)
        {
        case SEQ_START_SHORT_CODE:
            rez = processSeqStartCode(buff);
            if (rez != 0)
                return rez;
            nextNal = MPEGHeader::findNextMarker(buff, m_bufEnd) + 3;
            while (true)
            {
                if (nextNal >= m_bufEnd)
                    return NOT_ENOUGH_BUFFER;
                switch (*nextNal)
                {
                case EXT_START_SHORT_CODE:
                    rez = processExtStartCode(nextNal);
                    if (rez != 0)
                        return rez;
                    break;
                case GOP_START_SHORT_CODE:
                    m_framesAtGop = -1;
                    m_lastRef = -1;
                    break;
                case PICTURE_START_SHORT_CODE:
                    rez = decodePicture(nextNal);
                    if (rez == 0)
                    {
                        m_lastDecodedPos = nextNal;
                    }
                    return rez;
                default:;
                }
                nextNal = MPEGHeader::findNextMarker(nextNal, m_bufEnd) + 3;
            }
        case EXT_START_SHORT_CODE:
            return processExtStartCode(buff);
        case GOP_START_SHORT_CODE:
            m_framesAtGop = -1;
            m_lastRef = -1;
            break;
        case PICTURE_START_SHORT_CODE:
            rez = decodePicture(buff);
            return rez;
        default:;
        }
        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}